

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

void cmSystemTools::ReportLastSystemError(char *msg)

{
  string m;
  allocator<char> aaStack_48 [32];
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,msg,aaStack_48);
  std::__cxx11::string::append((char *)&local_28);
  cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
  std::__cxx11::string::append((string *)&local_28);
  std::__cxx11::string::~string((string *)aaStack_48);
  Error(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void cmSystemTools::ReportLastSystemError(const char* msg)
{
  std::string m = msg;
  m += ": System Error: ";
  m += Superclass::GetLastSystemError();
  cmSystemTools::Error(m);
}